

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdGetMnemonicWords(void *handle,char *language,char **mnemonic_words)

{
  bool bVar1;
  char *pcVar2;
  undefined8 *in_RDX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  string words;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  wordlist;
  HDWalletApi api;
  string lang;
  int result;
  allocator *this;
  allocator local_b9;
  string local_b8 [32];
  StringUtil local_98 [8];
  string *in_stack_ffffffffffffff70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string *in_stack_ffffffffffffffa0;
  HDWalletApi *in_stack_ffffffffffffffa8;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffa8);
  bVar1 = cfd::capi::IsEmptyString(in_RSI);
  if (!bVar1) {
    std::__cxx11::string::operator=((string *)&stack0xffffffffffffffa8,in_RSI);
  }
  cfd::api::HDWalletApi::HDWalletApi((HDWalletApi *)&stack0xffffffffffffffa7);
  cfd::api::HDWalletApi::GetMnemonicWordlist(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  this = &local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8," ",this);
  cfd::core::StringUtil::Join(local_98,&local_78,(string *)local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  pcVar2 = cfd::capi::CreateString(in_stack_ffffffffffffff70);
  *in_RDX = pcVar2;
  std::__cxx11::string::~string((string *)local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  return 0;
}

Assistant:

int CfdGetMnemonicWords(
    void* handle, const char* language, char** mnemonic_words) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();

    std::string lang;
    if (!IsEmptyString(language)) {
      lang = language;
    }
    HDWalletApi api;
    std::vector<std::string> wordlist = api.GetMnemonicWordlist(lang);
    auto words = StringUtil::Join(wordlist, " ");
    *mnemonic_words = CreateString(words);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}